

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O0

Order * __thiscall Market::find(Market *this,Side side,string *id)

{
  bool bVar1;
  __type_conflict _Var2;
  pointer ppVar3;
  string *psVar4;
  exception *this_00;
  _Self local_58;
  _Base_ptr local_50;
  _Rb_tree_iterator<std::pair<const_double,_Order>_> local_48;
  iterator i_1;
  _Rb_tree_iterator<std::pair<const_double,_Order>_> local_30;
  iterator i;
  string *id_local;
  Side side_local;
  Market *this_local;
  
  i._M_node = (_Base_ptr)id;
  if (side == buy) {
    std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::_Rb_tree_iterator(&local_30);
    local_30._M_node =
         (_Base_ptr)
         std::
         multimap<double,_Order,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
         ::begin(&this->m_bidOrders);
    while( true ) {
      i_1._M_node = (_Base_ptr)
                    std::
                    multimap<double,_Order,_std::greater<double>,_std::allocator<std::pair<const_double,_Order>_>_>
                    ::end(&this->m_bidOrders);
      bVar1 = std::operator!=(&local_30,&i_1);
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator->(&local_30);
      psVar4 = Order::getClientID_abi_cxx11_(&ppVar3->second);
      _Var2 = std::operator==(psVar4,id);
      if (_Var2) {
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator->(&local_30);
LAB_0015f01c:
        this_local = (Market *)&ppVar3->second;
        return (Order *)this_local;
      }
      std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator++(&local_30);
    }
  }
  else if (side == sell) {
    std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::_Rb_tree_iterator(&local_48);
    local_50 = (_Base_ptr)
               std::
               multimap<double,_Order,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
               ::begin(&this->m_askOrders);
    local_48._M_node = local_50;
    while( true ) {
      local_58._M_node =
           (_Base_ptr)
           std::
           multimap<double,_Order,_std::less<double>,_std::allocator<std::pair<const_double,_Order>_>_>
           ::end(&this->m_askOrders);
      bVar1 = std::operator!=(&local_48,&local_58);
      if (!bVar1) break;
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator->(&local_48);
      psVar4 = Order::getClientID_abi_cxx11_(&ppVar3->second);
      _Var2 = std::operator==(psVar4,id);
      if (_Var2) {
        ppVar3 = std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator->(&local_48);
        goto LAB_0015f01c;
      }
      std::_Rb_tree_iterator<std::pair<const_double,_Order>_>::operator++(&local_48);
    }
  }
  this_00 = (exception *)__cxa_allocate_exception(8);
  std::exception::exception(this_00);
  __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

Order &Market::find(Order::Side side, std::string id) {
  if (side == Order::buy) {
    BidOrders::iterator i;
    for (i = m_bidOrders.begin(); i != m_bidOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        return i->second;
      }
    }
  } else if (side == Order::sell) {
    AskOrders::iterator i;
    for (i = m_askOrders.begin(); i != m_askOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        return i->second;
      }
    }
  }
  throw std::exception();
}